

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O0

int ZSTD_needSequenceEntropyTables(ZSTD_fseCTablesMetadata_t *fseMetadata)

{
  ZSTD_fseCTablesMetadata_t *fseMetadata_local;
  
  if ((fseMetadata->llType == set_compressed) || (fseMetadata->llType == set_rle)) {
    fseMetadata_local._4_4_ = 1;
  }
  else if ((fseMetadata->mlType == set_compressed) || (fseMetadata->mlType == set_rle)) {
    fseMetadata_local._4_4_ = 1;
  }
  else if ((fseMetadata->ofType == set_compressed) || (fseMetadata->ofType == set_rle)) {
    fseMetadata_local._4_4_ = 1;
  }
  else {
    fseMetadata_local._4_4_ = 0;
  }
  return fseMetadata_local._4_4_;
}

Assistant:

static int ZSTD_needSequenceEntropyTables(ZSTD_fseCTablesMetadata_t const* fseMetadata)
{
    if (fseMetadata->llType == set_compressed || fseMetadata->llType == set_rle)
        return 1;
    if (fseMetadata->mlType == set_compressed || fseMetadata->mlType == set_rle)
        return 1;
    if (fseMetadata->ofType == set_compressed || fseMetadata->ofType == set_rle)
        return 1;
    return 0;
}